

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpki-rov.c
# Opt level: O1

int str_to_int(char *str,int *value)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = __errno_location();
  *piVar3 = 0;
  lVar4 = strtol(str,(char **)0x0,10);
  iVar1 = *piVar3;
  if (iVar1 == 0) {
    *value = (int)lVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (uint)(iVar1 != 0);
  }
  __stack_chk_fail();
}

Assistant:

static int str_to_int(const char *str, int *value)
{
	errno = 0;
	int tmp = strtol(str, NULL, 10);

	if (errno != 0)
		return 1;

	*value = tmp;
	return 0;
}